

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRFilter.cpp
# Opt level: O2

void SignalProcessing::FIRFilter::coefficients_for_idealised_filter_response
               (short *filter_coefficients,float *A,float attenuation,size_t number_of_taps)

{
  float fVar1;
  uint uVar2;
  pointer pfVar3;
  size_t i;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  vector<float,_std::allocator<float>_> filter_coefficients_float;
  allocator_type local_51;
  float local_50;
  float local_4c;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  fVar8 = 0.0;
  if (21.0 <= attenuation) {
    if (attenuation <= 50.0) {
      fVar8 = powf(attenuation + -21.0,0.4);
      fVar8 = fVar8 * 0.5842 + (attenuation + -21.0) * 0.7886;
    }
    else {
      fVar8 = (attenuation + -8.7) * 0.1102;
    }
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_48,number_of_taps,&local_51);
  uVar7 = number_of_taps - 1 >> 1;
  local_4c = ino(fVar8);
  local_50 = (float)(uVar7 * uVar7);
  for (uVar2 = 0; uVar6 = (ulong)uVar2, uVar6 <= uVar7; uVar2 = uVar2 + 1) {
    fVar1 = A[uVar6];
    fVar9 = 1.0 - (float)(uVar2 * uVar2) / local_50;
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      fVar9 = SQRT(fVar9);
    }
    fVar9 = ino(fVar9 * fVar8);
    local_48._M_impl.super__Vector_impl_data._M_start[uVar7 + uVar6] = (fVar1 * fVar9) / local_4c;
  }
  pfVar3 = local_48._M_impl.super__Vector_impl_data._M_start;
  for (lVar5 = 0; -lVar5 != uVar7; lVar5 = lVar5 + -1) {
    *pfVar3 = local_48._M_impl.super__Vector_impl_data._M_start[number_of_taps + lVar5 + -1];
    pfVar3 = pfVar3 + 1;
  }
  fVar8 = 0.0;
  for (sVar4 = 0; number_of_taps != sVar4; sVar4 = sVar4 + 1) {
    fVar8 = fVar8 + local_48._M_impl.super__Vector_impl_data._M_start[sVar4];
  }
  for (sVar4 = 0; number_of_taps != sVar4; sVar4 = sVar4 + 1) {
    filter_coefficients[sVar4] =
         (short)(int)(local_48._M_impl.super__Vector_impl_data._M_start[sVar4] * 32767.0 *
                     (1.0 / fVar8));
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void FIRFilter::coefficients_for_idealised_filter_response(short *filter_coefficients, float *A, float attenuation, std::size_t number_of_taps) {
	/* calculate alpha, which is the Kaiser-Bessel window shape factor */
	float a;	// to take the place of alpha in the normal derivation

	if(attenuation < 21.0f) {
		a = 0.0f;
	} else {
		if(attenuation > 50.0f)
			a = 0.1102f * (attenuation - 8.7f);
		else
			a = 0.5842f * powf(attenuation - 21.0f, 0.4f) + 0.7886f * (attenuation - 21.0f);
	}

	std::vector<float> filter_coefficients_float(number_of_taps);

	/* work out the right hand side of the filter coefficients */
	std::size_t Np = (number_of_taps - 1) / 2;
	float I0 = ino(a);
	float Np_squared = float(Np * Np);
	for(unsigned int i = 0; i <= Np; ++i) {
		filter_coefficients_float[Np + i] =
				A[i] *
				ino(a * sqrtf(1.0f - (float(i * i) / Np_squared) )) /
				I0;
	}

	/* coefficients are symmetrical, so copy from right hand side to left side */
	for(std::size_t i = 0; i < Np; ++i) {
		filter_coefficients_float[i] = filter_coefficients_float[number_of_taps - 1 - i];
	}

	/* scale back up so that we retain 100% of input volume */
	float coefficientTotal = 0.0f;
	for(std::size_t i = 0; i < number_of_taps; ++i) {
		coefficientTotal += filter_coefficients_float[i];
	}

	/* we'll also need integer versions, potentially */
	float coefficientMultiplier = 1.0f / coefficientTotal;
	for(std::size_t i = 0; i < number_of_taps; ++i) {
		filter_coefficients[i] = short(filter_coefficients_float[i] * FixedMultiplier * coefficientMultiplier);
	}
}